

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O2

void __thiscall
ParticleArrayTest_PushBack_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>::
TestBody(ParticleArrayTest_PushBack_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>
         *this)

{
  Particle<(pica::Dimension)1> particle;
  int iVar1;
  bool bVar2;
  AssertHelper local_1d8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  String local_1c8;
  AssertionResult gtest_ar_;
  Particle local_1a8;
  ParticleArray particles;
  ParticleArray particlesCopy;
  
  memset(&particles,0,0xa8);
  iVar1 = 0x11;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>::randomParticle
              (&local_1a8,(BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *)this);
    particle.p.x = local_1a8.p.x;
    particle.position.x = local_1a8.position.x;
    particle.p.y = local_1a8.p.y;
    particle.p.z = local_1a8.p.z;
    particle.factor = local_1a8.factor;
    particle.invGamma = local_1a8.invGamma;
    particle.typeIndex = local_1a8.typeIndex;
    particle._50_6_ = local_1a8._50_6_;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>>::
    pushBack<pica::Particle<(pica::Dimension)1>>
              ((ParticleArraySoA<pica::Particle<(pica::Dimension)1>> *)&particles,particle);
  }
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>::ParticleArraySoA
            (&particlesCopy,&particles);
  gtest_ar_.success_ =
       ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>::
       eqParticleArrays(&this->
                         super_ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>
                        ,&particles,&particlesCopy);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)&local_1c8,&gtest_ar_,"this->eqParticleArrays(particles, particlesCopy)",
               "false","true");
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x75,local_1c8.c_str_);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::internal::String::~String(&local_1c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_1d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>::~ParticleArraySoA(&particlesCopy);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>::~ParticleArraySoA(&particles);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, PushBack)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    for (int i = 0; i < 17; i++)
        particles.pushBack(this->randomParticle());
    ParticleArray particlesCopy(particles);
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesCopy));
}